

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::Descriptor::ExtensionRange::CopyTo
          (ExtensionRange *this,DescriptorProto_ExtensionRange *proto)

{
  byte *pbVar1;
  uint uVar2;
  FeatureSet *from;
  ExtensionRangeOptions *this_00;
  ExtensionRangeOptions *pEVar3;
  FeatureSet *this_01;
  Arena *pAVar4;
  
  (proto->field_0)._impl_.start_ = this->start_;
  uVar2 = *(uint *)&proto->field_0;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 2;
  (proto->field_0)._impl_.end_ = this->end_;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 6;
  pEVar3 = this->options_;
  if (pEVar3 != (ExtensionRangeOptions *)_ExtensionRangeOptions_default_instance_) {
    (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 7;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (ExtensionRangeOptions *)0x0) {
      pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      this_00 = (ExtensionRangeOptions *)
                Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(pAVar4);
      (proto->field_0)._impl_.options_ = this_00;
    }
    ExtensionRangeOptions::CopyFrom(this_00,pEVar3);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 1;
    pEVar3 = (proto->field_0)._impl_.options_;
    if (pEVar3 == (ExtensionRangeOptions *)0x0) {
      pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      pEVar3 = (ExtensionRangeOptions *)
               Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(pAVar4);
      (proto->field_0)._impl_.options_ = pEVar3;
    }
    pbVar1 = (byte *)((long)&pEVar3->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 1;
    this_01 = (pEVar3->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar4 = (Arena *)(pEVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar4);
      (pEVar3->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void Descriptor::ExtensionRange::CopyTo(
    DescriptorProto_ExtensionRange* proto) const {
  proto->set_start(start_);
  proto->set_end(end_);
  if (options_ != &ExtensionRangeOptions::default_instance()) {
    *proto->mutable_options() = *options_;
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}